

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitffi-sysv64.cpp
# Opt level: O0

void JitFFI::SysV64::create_argument(JitFuncCallerCreater *jfcc,ArgumentList *list)

{
  bool bVar1;
  uint int_c;
  uint dou_c;
  uint64_t local_28;
  uint64_t data;
  ArgumentList *pAStack_18;
  OP type;
  ArgumentList *list_local;
  JitFuncCallerCreater *jfcc_local;
  
  pAStack_18 = list;
  list_local = (ArgumentList *)jfcc;
  int_c = ArgumentList::get_int_count(list);
  dou_c = ArgumentList::get_float_count(pAStack_18);
  JitFuncCallerCreater::init_addarg_count(jfcc,int_c,dou_c);
  while (bVar1 = ArgumentList::get_next(pAStack_18,(OP *)((long)&data + 7),&local_28), bVar1) {
    switch(data._7_1_) {
    case 0:
      JitFuncCallerCreater::add_void((JitFuncCallerCreater *)list_local);
      break;
    case 1:
      JitFuncCallerCreater::add_int((JitFuncCallerCreater *)list_local,local_28);
      break;
    case 2:
      JitFuncCallerCreater::add_double((JitFuncCallerCreater *)list_local,local_28);
      break;
    case 3:
      JitFuncCallerCreaterX64::push((JitFuncCallerCreaterX64 *)list_local,local_28);
      break;
    default:
      printf("%d\n",(ulong)data._7_1_);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/CVM-Projects[P]JitFFI/source/jitffi-sysv64.cpp"
                    ,0x338,
                    "void JitFFI::SysV64::create_argument(JitFuncCallerCreater &, ArgumentList &)");
    }
  }
  return;
}

Assistant:

static void create_argument(JitFuncCallerCreater &jfcc, ArgumentList &list) {
			ArgTypeInfo::OP type;
			uint64_t data;

			jfcc.init_addarg_count(list.get_int_count(), list.get_float_count());

			while (list.get_next(type, data)) {
				switch (type) {
				case ArgTypeInfo::op_void:
					jfcc.add_void();
					break;
				case ArgTypeInfo::op_int:
					jfcc.add_int(data);
					break;
				case ArgTypeInfo::op_float:
					jfcc.add_double(data);
					break;
				case ArgTypeInfo::op_memory:
					jfcc.push(data);
					break;
				default:
					printf("%d\n", type);
					assert(false);
				}
			}
		}